

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_header_magic(p_ply ply)

{
  int iVar1;
  long in_RDI;
  char *magic;
  p_ply in_stack_ffffffffffffffd8;
  bool local_19;
  
  iVar1 = BREFILL(in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    (**(code **)(in_RDI + 0x20e0))(in_RDI,"Unable to read magic number from file");
  }
  else {
    if ((((*(char *)(in_RDI + 0x4c) == 'p') && (*(char *)(in_RDI + 0x4d) == 'l')) &&
        (*(char *)(in_RDI + 0x4e) == 'y')) &&
       (iVar1 = isspace((int)*(char *)(in_RDI + 0x4f)), iVar1 != 0)) {
      local_19 = false;
      if (*(char *)(in_RDI + 0x4f) == '\r') {
        local_19 = *(char *)(in_RDI + 0x50) == '\n';
      }
      *(uint *)(in_RDI + 0x48) = (uint)local_19;
      *(long *)(in_RDI + 0x2050) = *(long *)(in_RDI + 0x2050) + 3;
      return 1;
    }
    (**(code **)(in_RDI + 0x20e0))(in_RDI,"Wrong magic number. Expected \'ply\'");
  }
  return 0;
}

Assistant:

static int ply_read_header_magic(p_ply ply) {
    char *magic = ply->buffer;
    if (!BREFILL(ply)) {
        ply->error_cb(ply, "Unable to read magic number from file");
        return 0;
    }
    /* check if it is ply */
    if (magic[0] != 'p' || magic[1] != 'l' || magic[2] != 'y' ||
        !isspace(magic[3])) {
        ply->error_cb(ply, "Wrong magic number. Expected 'ply'");
        return 0;
    }
    /* figure out if we have to skip the extra character
     * after header when we reach the binary part of file */
    ply->rn = magic[3] == '\r' && magic[4] == '\n';
    BSKIP(ply, 3);
    return 1;
}